

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_reshape_1d(ggml_context *ctx,ggml_tensor *a,int64_t ne0)

{
  _Bool _Var1;
  int64_t iVar2;
  ggml_tensor *tensor;
  long in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *result;
  int64_t ne [1];
  size_t in_stack_00000190;
  ggml_tensor *in_stack_00000198;
  int64_t *in_stack_000001a0;
  int in_stack_000001a8;
  ggml_type in_stack_000001ac;
  ggml_context *in_stack_000001b0;
  
  _Var1 = ggml_is_contiguous((ggml_tensor *)0x14dc6d);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xc08,"GGML_ASSERT(%s) failed","ggml_is_contiguous(a)");
  }
  iVar2 = ggml_nelements(in_RSI);
  if (iVar2 != in_RDX) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0xc09,"GGML_ASSERT(%s) failed","ggml_nelements(a) == ne0");
  }
  tensor = ggml_new_tensor_impl
                     (in_stack_000001b0,in_stack_000001ac,in_stack_000001a8,in_stack_000001a0,
                      in_stack_00000198,in_stack_00000190);
  ggml_format_name(tensor,"%s (reshaped)",in_RSI->name);
  tensor->op = GGML_OP_RESHAPE;
  tensor->src[0] = in_RSI;
  return tensor;
}

Assistant:

struct ggml_tensor * ggml_reshape_1d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int64_t               ne0) {
    GGML_ASSERT(ggml_is_contiguous(a));
    GGML_ASSERT(ggml_nelements(a) == ne0);

    const int64_t ne[1] = { ne0 };
    struct ggml_tensor * result = ggml_new_tensor_impl(ctx, a->type, 1, ne, a, 0);
    ggml_format_name(result, "%s (reshaped)", a->name);

    result->op     = GGML_OP_RESHAPE;
    result->src[0] = a;

    return result;
}